

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::TracingSession::TracingSession
          (TracingSession *this,TracingSessionID session_id,ConsumerEndpointImpl *consumer,
          TraceConfig *new_config,TaskRunner *task_runner)

{
  _Rb_tree_header *p_Var1;
  pointer *__ptr;
  int local_38 [2];
  
  this->id = session_id;
  this->consumer_maybe_null = consumer;
  this->consumer_uid = consumer->uid_;
  (this->received_triggers).
  super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->received_triggers).
  super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->received_triggers).
  super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  protos::gen::TraceConfig::TraceConfig(&this->config,new_config);
  p_Var1 = &(this->data_source_instances)._M_t._M_impl.super__Rb_tree_header;
  (this->data_source_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data_source_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->data_source_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->data_source_instances)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->data_source_instances)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->pending_flushes)._M_t._M_impl.super__Rb_tree_header;
  (this->pending_flushes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pending_flushes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pending_flushes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pending_flushes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  p_Var1 = &(this->packet_sequence_ids)._M_t._M_impl.super__Rb_tree_header;
  (this->packet_sequence_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->packet_sequence_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->pending_flushes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->buffers_index).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_index).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_index).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->packet_sequence_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->packet_sequence_ids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->packet_sequence_ids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->last_packet_sequence_id = 1;
  *(undefined8 *)&this->should_emit_stats = 0;
  *(undefined8 *)((long)&this->num_triggers_emitted_into_trace + 4) = 0;
  *(undefined8 *)((long)&this->invalid_packets + 4) = 0;
  *(undefined8 *)((long)&this->flushes_requested + 4) = 0;
  *(undefined8 *)((long)&this->flushes_succeeded + 4) = 0;
  *(undefined8 *)((long)&this->flushes_failed + 4) = 0;
  this->did_notify_all_data_source_started = false;
  (this->initial_clock_snapshot).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->initial_clock_snapshot).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lifecycle_events).
  super__Vector_base<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,_std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->initial_clock_snapshot).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lifecycle_events).
  super__Vector_base<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,_std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lifecycle_events).
  super__Vector_base<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,_std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  base::
  CircularQueue<std::vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>_>
  ::CircularQueue(&this->clock_snapshot_ring_buffer,0x400);
  this->state = DISABLED;
  (this->detach_key)._M_dataplus._M_p = (pointer)&(this->detach_key).field_2;
  (this->detach_key)._M_string_length = 0;
  (this->detach_key).field_2._M_local_buf[0] = '\0';
  (this->write_into_file).t_ = -1;
  *(undefined8 *)&this->write_period_ms = 0;
  *(undefined8 *)((long)&this->max_file_size_bytes + 4) = 0;
  *(undefined8 *)((long)&this->bytes_written_into_file + 4) = 0;
  *(undefined8 *)
   ((long)&(this->on_disable_callback_for_bugreport).super__Function_base._M_functor + 4) = 0;
  *(undefined8 *)
   ((long)&(this->on_disable_callback_for_bugreport).super__Function_base._M_functor + 0xc) = 0;
  *(undefined8 *)
   ((long)&(this->on_disable_callback_for_bugreport).super__Function_base._M_manager + 4) = 0;
  *(undefined8 *)((long)&(this->on_disable_callback_for_bugreport)._M_invoker + 1) = 0;
  base::PeriodicTask::PeriodicTask(&this->snapshot_periodic_task,task_runner);
  this->filter_input_bytes = 0;
  this->filter_output_bytes = 0;
  (this->trace_filter)._M_t.
  super___uniq_ptr_impl<protozero::MessageFilter,_std::default_delete<protozero::MessageFilter>_>.
  _M_t.
  super__Tuple_impl<0UL,_protozero::MessageFilter_*,_std::default_delete<protozero::MessageFilter>_>
  .super__Head_base<0UL,_protozero::MessageFilter_*,_false>._M_head_impl = (MessageFilter *)0x0;
  this->filter_input_packets = 0;
  this->filter_errors = 0;
  local_38[1] = 3;
  local_38[0] = 0x40;
  ::std::
  vector<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>>
  ::emplace_back<perfetto::protos::pbzero::TracingServiceEvent::_unnamed_type_1_,int>
            ((vector<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent,std::allocator<perfetto::TracingServiceImpl::TracingSession::LifecycleEvent>>
              *)&this->lifecycle_events,(anon_enum_32 *)(local_38 + 1),local_38);
  return;
}

Assistant:

TracingServiceImpl::TracingSession::TracingSession(
    TracingSessionID session_id,
    ConsumerEndpointImpl* consumer,
    const TraceConfig& new_config,
    base::TaskRunner* task_runner)
    : id(session_id),
      consumer_maybe_null(consumer),
      consumer_uid(consumer->uid_),
      config(new_config),
      snapshot_periodic_task(task_runner) {
  // all_data_sources_flushed is special because we store up to 64 events of
  // this type. Other events will go through the default case in
  // SnapshotLifecycleEvent() where they will be given a max history of 1.
  lifecycle_events.emplace_back(
      protos::pbzero::TracingServiceEvent::kAllDataSourcesFlushedFieldNumber,
      64 /* max_size */);
}